

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

Gia_Man_t * Gia_ManIsoNpnReduce(Gia_Man_t *p,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  word wVar5;
  Vec_Mem_t *p_00;
  uint uVar6;
  int iVar7;
  Vec_Wec_t *p_01;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  uint *puVar11;
  void *pvVar12;
  undefined8 *puVar13;
  word *pTruth;
  ulong uVar14;
  word **ppwVar15;
  word *pwVar16;
  Gia_Man_t *pGVar17;
  Vec_Ptr_t *pVVar18;
  void **ppvVar19;
  byte bVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint *pTruthU;
  word *pwVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  void *pvVar31;
  word *tLimit;
  ulong uVar32;
  int iVar33;
  word *pwVar34;
  ulong uVar35;
  size_t __size;
  uint uVar36;
  long lVar37;
  long lVar38;
  bool bVar39;
  int iObj;
  char pCanonPerm [16];
  Vec_Int_t *vTt2Class [17];
  Vec_Mem_t *vTtMem [17];
  byte local_1a4;
  uint local_190;
  uint local_18c;
  int local_16c;
  Vec_Ptr_t **local_168;
  ulong local_160;
  char local_158 [16];
  long alStack_148 [18];
  undefined8 auStack_b8 [17];
  
  local_168 = pvPosEquivs;
  p_01 = (Vec_Wec_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  pVVar8 = (Vec_Int_t *)calloc(100,0x10);
  p_01->pArray = pVVar8;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0x10;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(0x40);
  pVVar9->pArray = piVar10;
  pVVar8 = p->vCos;
  uVar35 = 0;
  do {
    iVar21 = 1 << ((char)uVar35 - 6U & 0x1f);
    if (uVar35 < 7) {
      iVar21 = 1;
    }
    piVar10 = (int *)calloc(1,0x30);
    *piVar10 = iVar21;
    piVar10[2] = 10;
    piVar10[3] = 0x3ff;
    piVar10[5] = -1;
    auStack_b8[uVar35] = piVar10;
    uVar27 = 999;
    while( true ) {
      do {
        uVar36 = uVar27;
        uVar27 = uVar36 + 1;
      } while ((uVar36 & 1) != 0);
      if (uVar27 < 9) break;
      iVar21 = 5;
      while (uVar27 % (iVar21 - 2U) != 0) {
        uVar6 = iVar21 * iVar21;
        iVar21 = iVar21 + 2;
        if (uVar27 < uVar6) goto LAB_0023b867;
      }
    }
LAB_0023b867:
    puVar11 = (uint *)malloc(0x10);
    uVar6 = uVar27;
    if (uVar36 < 0xf) {
      uVar6 = 0x10;
    }
    *puVar11 = uVar6;
    pvVar12 = malloc((long)(int)uVar6 << 2);
    *(void **)(puVar11 + 2) = pvVar12;
    puVar11[1] = uVar27;
    if (pvVar12 != (void *)0x0) {
      memset(pvVar12,0xff,(long)(int)uVar27 << 2);
    }
    *(uint **)(piVar10 + 8) = puVar11;
    puVar13 = (undefined8 *)malloc(0x10);
    *puVar13 = 1000;
    pvVar12 = malloc(4000);
    puVar13[1] = pvVar12;
    *(undefined8 **)(piVar10 + 10) = puVar13;
    uVar28 = (ulong)pVVar8->nSize;
    lVar37 = uVar28 + 1;
    piVar10 = (int *)malloc(0x10);
    iVar33 = (int)lVar37;
    iVar21 = iVar33;
    if (uVar28 < 0xf) {
      iVar21 = 0x10;
    }
    *piVar10 = iVar21;
    if (iVar21 == 0) {
      piVar10[2] = 0;
      piVar10[3] = 0;
      piVar10[1] = iVar33;
    }
    else {
      pvVar12 = malloc((long)iVar21 << 2);
      *(void **)(piVar10 + 2) = pvVar12;
      piVar10[1] = iVar33;
      if (pvVar12 != (void *)0x0) {
        memset(pvVar12,0xff,lVar37 * 4);
      }
    }
    alStack_148[uVar35] = (long)piVar10;
    uVar35 = uVar35 + 1;
  } while (uVar35 != 0x11);
  Gia_ObjComputeTruthTableStart(p,0x10);
  pVVar8 = p->vCos;
  uVar35 = (ulong)(uint)pVVar8->nSize;
  if (p->nRegs < pVVar8->nSize) {
    local_18c = 0xffffffff;
    lVar37 = 0;
    local_190 = 0xffffffff;
LAB_0023b98a:
    if ((int)uVar35 <= lVar37) goto LAB_0023c70f;
    iVar21 = pVVar8->pArray[lVar37];
    if (((long)iVar21 < 0) || (p->nObjs <= iVar21)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar1 = p->pObjs;
    if (pGVar1 != (Gia_Obj_t *)0x0) {
      local_16c = iVar21;
      Gia_ManCollectCis(p,&local_16c,1,pVVar9);
      iVar33 = (int)lVar37;
      if (pVVar9->nSize < 0x11) {
        pGVar1 = pGVar1 + iVar21;
        uVar35 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
        if ((~*(ulong *)(pGVar1 + -uVar35) & 0x1fffffff1fffffff) == 0) goto LAB_0023bd45;
        uVar27 = (uint)*(ulong *)(pGVar1 + -uVar35);
        if ((~uVar27 & 0x9fffffff) != 0) {
          if (((int)uVar27 < 0) || ((uVar27 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                          ,0x2f7,"Gia_Man_t *Gia_ManIsoNpnReduce(Gia_Man_t *, Vec_Ptr_t **, int)");
          }
          pTruth = Gia_ObjComputeTruthTableCut(p,pGVar1 + -uVar35,pVVar9);
          uVar27 = pVVar9->nSize;
          uVar35 = (ulong)(int)uVar27;
          if (0x10 < (long)uVar35) {
            __assert_fail("nVarsAll <= 16",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                          ,0x6ec,"int Abc_TtMinimumBase(word *, int *, int, int *)");
          }
          if (0 < (int)uVar27) {
            uVar30 = (ulong)(uint)(1 << ((char)uVar27 - 6U & 0x1f));
            uVar28 = 0;
            uVar36 = 0;
            iVar21 = 0;
LAB_0023babe:
            bVar20 = (byte)uVar28;
            if (uVar27 < 7) {
              uVar25 = 1 << (bVar20 & 0x1f);
              bVar39 = ((*pTruth >> ((byte)uVar25 & 0x3f) ^ *pTruth) & s_Truths6Neg[uVar28]) != 0;
              if (!bVar39) {
                uVar25 = 0;
              }
              iVar21 = iVar21 + (uint)bVar39;
            }
            else if (uVar28 < 6) {
              uVar25 = 1 << (bVar20 & 0x1f);
              uVar32 = 0;
              do {
                if (((pTruth[uVar32] >> ((byte)uVar25 & 0x3f) ^ pTruth[uVar32]) &
                    s_Truths6Neg[uVar28]) != 0) goto LAB_0023bb8c;
                uVar32 = uVar32 + 1;
              } while (uVar30 != uVar32);
              uVar25 = 0 << (bVar20 & 0x1f);
            }
            else {
              uVar32 = (ulong)(uint)(1 << (bVar20 - 6 & 0x1f));
              uVar6 = 2 << (bVar20 - 6 & 0x1f);
              pwVar24 = pTruth + uVar32;
              pwVar16 = pTruth;
              do {
                uVar14 = 0;
                do {
                  if (pwVar16[uVar14] != pwVar24[uVar14]) {
                    uVar25 = 1 << (bVar20 & 0x1f);
                    goto LAB_0023bb8c;
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar32 != uVar14);
                pwVar16 = pwVar16 + uVar6;
                pwVar24 = pwVar24 + uVar6;
                uVar25 = 0;
              } while (pwVar16 < pTruth + uVar30);
            }
            goto LAB_0023bb8e;
          }
          goto LAB_0023bd45;
        }
        goto LAB_0023ba47;
      }
      pVVar8 = Vec_WecPushLevel(p_01);
      goto LAB_0023b9ef;
    }
  }
LAB_0023c2bf:
  Gia_ObjComputeTruthTableStop(p);
  if (pVVar9->pArray != (int *)0x0) {
    free(pVVar9->pArray);
  }
  free(pVVar9);
  lVar37 = 0;
  do {
    pvVar12 = (void *)auStack_b8[lVar37];
    if (pvVar12 != (void *)0x0) {
      pvVar31 = *(void **)((long)pvVar12 + 0x20);
      if (pvVar31 != (void *)0x0) {
        if (*(void **)((long)pvVar31 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar31 + 8));
          *(undefined8 *)(*(long *)((long)pvVar12 + 0x20) + 8) = 0;
          pvVar31 = *(void **)((long)pvVar12 + 0x20);
          if (pvVar31 == (void *)0x0) goto LAB_0023c32c;
        }
        free(pvVar31);
        *(undefined8 *)((long)pvVar12 + 0x20) = 0;
      }
LAB_0023c32c:
      pvVar31 = *(void **)((long)pvVar12 + 0x28);
      if (pvVar31 != (void *)0x0) {
        if (*(void **)((long)pvVar31 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar31 + 8));
          *(undefined8 *)(*(long *)((long)pvVar12 + 0x28) + 8) = 0;
          pvVar31 = *(void **)((long)pvVar12 + 0x28);
          if (pvVar31 == (void *)0x0) goto LAB_0023c368;
        }
        free(pvVar31);
        *(undefined8 *)((long)pvVar12 + 0x28) = 0;
      }
    }
LAB_0023c368:
    iVar21 = *(int *)((long)pvVar12 + 0x14);
    if (-1 < iVar21) {
      lVar38 = -1;
      do {
        pvVar31 = *(void **)(*(long *)((long)pvVar12 + 0x18) + 8 + lVar38 * 8);
        if (pvVar31 != (void *)0x0) {
          free(pvVar31);
          *(undefined8 *)(*(long *)((long)pvVar12 + 0x18) + 8 + lVar38 * 8) = 0;
          iVar21 = *(int *)((long)pvVar12 + 0x14);
        }
        lVar38 = lVar38 + 1;
      } while (lVar38 < iVar21);
    }
    if (*(void **)((long)pvVar12 + 0x18) != (void *)0x0) {
      free(*(void **)((long)pvVar12 + 0x18));
    }
    free(pvVar12);
    pvVar12 = (void *)alStack_148[lVar37];
    pvVar31 = *(void **)((long)pvVar12 + 8);
    if (pvVar31 != (void *)0x0) {
      free(pvVar31);
    }
    free(pvVar12);
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0x11);
  uVar27 = p_01->nSize;
  uVar35 = (ulong)uVar27;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  uVar36 = 0x10;
  if (0xe < uVar27 - 1) {
    uVar36 = uVar27;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = uVar36;
  iVar21 = 0;
  if (uVar36 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)(int)uVar36 << 2);
  }
  pVVar8->pArray = piVar10;
  if (0 < (int)uVar27) {
    pVVar9 = p_01->pArray;
    lVar37 = 0;
    do {
      if (0 < *(int *)((long)&pVVar9->nSize + lVar37)) {
        Vec_IntPush(pVVar8,**(int **)((long)&pVVar9->pArray + lVar37));
      }
      lVar37 = lVar37 + 0x10;
    } while (uVar35 << 4 != lVar37);
    piVar10 = pVVar8->pArray;
    iVar21 = pVVar8->nSize;
  }
  pGVar17 = Gia_ManDupCones(p,piVar10,iVar21,0);
  if (piVar10 != (int *)0x0) {
    free(piVar10);
  }
  free(pVVar8);
  if ((fVerbose != 0) && (puts("Nontrivial classes:"), 0 < (int)uVar27)) {
    pVVar8 = p_01->pArray;
    uVar28 = 0;
    do {
      if (pVVar8[uVar28].nSize != 1) {
        printf(" %4d : {",uVar28 & 0xffffffff);
        if (0 < pVVar8[uVar28].nSize) {
          lVar37 = 0;
          do {
            printf(" %d",(ulong)(uint)pVVar8[uVar28].pArray[lVar37]);
            lVar37 = lVar37 + 1;
          } while (lVar37 < pVVar8[uVar28].nSize);
        }
        puts(" }");
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != uVar35);
  }
  if (local_168 != (Vec_Ptr_t **)0x0) {
    pVVar18 = (Vec_Ptr_t *)malloc(0x10);
    uVar36 = 8;
    if (6 < uVar27 - 1) {
      uVar36 = uVar27;
    }
    pVVar18->nSize = 0;
    pVVar18->nCap = uVar36;
    if (uVar36 == 0) {
      ppvVar19 = (void **)0x0;
    }
    else {
      ppvVar19 = (void **)malloc((long)(int)uVar36 << 3);
    }
    pVVar18->pArray = ppvVar19;
    if (0 < (int)uVar27) {
      lVar37 = 8;
      uVar28 = 0;
      do {
        pVVar8 = p_01->pArray;
        piVar10 = (int *)malloc(0x10);
        iVar21 = *(int *)((long)pVVar8 + lVar37 + -4);
        piVar10[1] = iVar21;
        *piVar10 = iVar21;
        if ((long)iVar21 == 0) {
          __size = 0;
          pvVar12 = (void *)0x0;
        }
        else {
          __size = (long)iVar21 << 2;
          pvVar12 = malloc(__size);
        }
        *(void **)(piVar10 + 2) = pvVar12;
        memcpy(pvVar12,*(void **)((long)&pVVar8->nCap + lVar37),__size);
        if ((uint)uVar28 == uVar36) {
          ppvVar19 = pVVar18->pArray;
          if (uVar28 < 0x10) {
            if (ppvVar19 == (void **)0x0) {
              ppvVar19 = (void **)malloc(0x80);
            }
            else {
              ppvVar19 = (void **)realloc(ppvVar19,0x80);
            }
            pVVar18->pArray = ppvVar19;
            uVar36 = 0x10;
          }
          else {
            if (ppvVar19 == (void **)0x0) {
              ppvVar19 = (void **)malloc(lVar37 - 8U);
            }
            else {
              ppvVar19 = (void **)realloc(ppvVar19,lVar37 - 8U);
            }
            pVVar18->pArray = ppvVar19;
            uVar36 = uVar36 * 2;
          }
        }
        else {
          ppvVar19 = pVVar18->pArray;
        }
        ppvVar19[uVar28] = piVar10;
        uVar28 = uVar28 + 1;
        lVar37 = lVar37 + 0x10;
      } while (uVar35 != uVar28);
      pVVar18->nSize = uVar27;
      pVVar18->nCap = uVar36;
    }
    *local_168 = pVVar18;
  }
  iVar21 = p_01->nCap;
  pVVar8 = p_01->pArray;
  if ((long)iVar21 < 1) {
    if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_0023c6d1;
  }
  else {
    lVar37 = 0;
    do {
      pvVar12 = *(void **)((long)&pVVar8->pArray + lVar37);
      if (pvVar12 != (void *)0x0) {
        free(pvVar12);
        *(undefined8 *)((long)&pVVar8->pArray + lVar37) = 0;
      }
      lVar37 = lVar37 + 0x10;
    } while ((long)iVar21 * 0x10 != lVar37);
  }
  free(pVVar8);
LAB_0023c6d1:
  free(p_01);
  return pGVar17;
LAB_0023bb8c:
  iVar21 = iVar21 + 1;
LAB_0023bb8e:
  uVar36 = uVar36 | uVar25;
  uVar28 = uVar28 + 1;
  if (uVar28 == uVar35) goto code_r0x0023bb9d;
  goto LAB_0023babe;
code_r0x0023bb9d:
  if (uVar36 != 0) {
    if ((int)uVar36 < 1) {
      __assert_fail("Supp > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x575,"int Abc_TtSuppIsMinBase(int)");
    }
    if ((uVar36 + 1 & uVar36) != 0) {
      if (uVar27 < 7) {
        uVar30 = 1;
      }
      uVar28 = 0;
      iVar7 = 0;
      do {
        if ((uVar36 >> ((uint)uVar28 & 0x1f) & 1) != 0) {
          if (iVar7 < (int)(uint)uVar28) {
            uVar32 = uVar28;
            do {
              uVar14 = uVar32 - 1;
              if ((long)uVar32 < 6) {
                uVar32 = s_PMasks[uVar14][0];
                uVar2 = s_PMasks[uVar14][1];
                uVar3 = s_PMasks[uVar14][2];
                uVar29 = 0;
                do {
                  uVar4 = pTruth[uVar29];
                  bVar20 = (byte)(1 << ((byte)uVar14 & 0x1f));
                  pTruth[uVar29] =
                       (uVar4 & uVar3) >> (bVar20 & 0x3f) |
                       (uVar4 & uVar2) << (bVar20 & 0x3f) | uVar4 & uVar32;
                  uVar29 = uVar29 + 1;
                } while (uVar30 != uVar29);
              }
              else {
                pwVar16 = pTruth;
                if (uVar14 == 5) {
                  do {
                    *(ulong *)((long)pwVar16 + 4) =
                         CONCAT44((int)*(undefined8 *)((long)pwVar16 + 4),
                                  (int)((ulong)*(undefined8 *)((long)pwVar16 + 4) >> 0x20));
                    pwVar16 = pwVar16 + 2;
                  } while (pwVar16 < pTruth + uVar30);
                }
                else {
                  uVar27 = 1 << ((char)uVar32 - 7U & 0x1f);
                  if (uVar32 < 8) {
                    uVar27 = 1;
                  }
                  iVar22 = uVar27 * 4;
                  pwVar34 = pTruth + uVar27 * 2;
                  pwVar24 = pTruth + uVar27;
                  do {
                    if (0 < (int)uVar27) {
                      uVar32 = 0;
                      do {
                        wVar5 = pwVar24[uVar32];
                        pwVar24[uVar32] = pwVar34[uVar32];
                        pwVar34[uVar32] = wVar5;
                        uVar32 = uVar32 + 1;
                      } while (uVar27 != uVar32);
                    }
                    pwVar16 = pwVar16 + iVar22;
                    pwVar34 = pwVar34 + iVar22;
                    pwVar24 = pwVar24 + iVar22;
                  } while (pwVar16 < pTruth + uVar30);
                }
              }
              uVar32 = uVar14;
            } while ((long)iVar7 < (long)uVar14);
          }
          iVar7 = iVar7 + 1;
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar35);
      if (iVar7 != iVar21) {
        __assert_fail("Var == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x6e7,"void Abc_TtShrink(word *, int, int, unsigned int)");
      }
    }
  }
  if (iVar21 == 1) {
LAB_0023ba47:
    uVar27 = p_01->nSize;
    if (local_190 == 0xffffffff) {
      Vec_WecPushLevel(p_01);
      local_190 = uVar27;
      uVar27 = p_01->nSize;
    }
    if ((int)uVar27 <= (int)local_190) {
      uVar36 = local_190 + 1;
      uVar6 = uVar27 * 2;
      if ((int)(uVar27 * 2) <= (int)uVar36) {
        uVar6 = uVar36;
      }
      iVar21 = p_01->nCap;
      if (iVar21 < (int)uVar6) {
        if (p_01->pArray == (Vec_Int_t *)0x0) {
          pVVar8 = (Vec_Int_t *)malloc((long)(int)uVar6 << 4);
        }
        else {
          pVVar8 = (Vec_Int_t *)realloc(p_01->pArray,(long)(int)uVar6 << 4);
        }
        p_01->pArray = pVVar8;
        memset(pVVar8 + iVar21,0,(long)(int)(uVar6 - iVar21) << 4);
        p_01->nCap = uVar6;
      }
      p_01->nSize = uVar36;
      uVar27 = uVar36;
    }
    if (((int)local_190 < 0) || ((int)uVar27 <= (int)local_190)) {
LAB_0023c72e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    Vec_IntPush(p_01->pArray + local_190,iVar33);
  }
  else {
    if (iVar21 == 0) {
LAB_0023bd45:
      uVar27 = p_01->nSize;
      if (local_18c == 0xffffffff) {
        Vec_WecPushLevel(p_01);
        local_18c = uVar27;
        uVar27 = p_01->nSize;
      }
      if ((int)uVar27 <= (int)local_18c) {
        uVar36 = local_18c + 1;
        uVar6 = uVar27 * 2;
        if ((int)(uVar27 * 2) <= (int)uVar36) {
          uVar6 = uVar36;
        }
        iVar21 = p_01->nCap;
        if (iVar21 < (int)uVar6) {
          if (p_01->pArray == (Vec_Int_t *)0x0) {
            pVVar8 = (Vec_Int_t *)malloc((long)(int)uVar6 << 4);
          }
          else {
            pVVar8 = (Vec_Int_t *)realloc(p_01->pArray,(long)(int)uVar6 << 4);
          }
          p_01->pArray = pVVar8;
          memset(pVVar8 + iVar21,0,(long)(int)(uVar6 - iVar21) << 4);
          p_01->nCap = uVar6;
        }
        p_01->nSize = uVar36;
        uVar27 = uVar36;
      }
      if (((int)local_18c < 0) || ((int)uVar27 <= (int)local_18c)) goto LAB_0023c72e;
      Vec_IntPush(p_01->pArray + local_18c,iVar33);
      goto LAB_0023bf71;
    }
    Abc_TtCanonicize(pTruth,iVar21,local_158);
    p_00 = (Vec_Mem_t *)auStack_b8[iVar21];
    iVar7 = p_00->nEntries;
    pVVar8 = p_00->vTable;
    if (pVVar8->nSize < iVar7) {
      uVar35 = (ulong)(pVVar8->nSize * 2 - 1);
      while( true ) {
        do {
          uVar27 = (uint)uVar35;
          uVar36 = uVar27 + 1;
          uVar30 = (ulong)uVar36;
          uVar28 = uVar35 & 1;
          uVar35 = uVar30;
        } while (uVar28 != 0);
        if (uVar36 < 9) break;
        iVar22 = 5;
        while (uVar36 % (iVar22 - 2U) != 0) {
          uVar6 = iVar22 * iVar22;
          iVar22 = iVar22 + 2;
          if (uVar36 < uVar6) goto LAB_0023bee0;
        }
      }
LAB_0023bee0:
      if (pVVar8->nCap < (int)uVar36) {
        if (pVVar8->pArray == (int *)0x0) {
          piVar10 = (int *)malloc((long)(int)uVar36 << 2);
        }
        else {
          piVar10 = (int *)realloc(pVVar8->pArray,(long)(int)uVar36 << 2);
        }
        pVVar8->pArray = piVar10;
        if (piVar10 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar8->nCap = uVar36;
      }
      if (uVar27 < 0x7fffffff) {
        memset(pVVar8->pArray,0xff,uVar30 << 2);
      }
      pVVar8->nSize = uVar36;
      p_00->vNexts->nSize = 0;
      iVar22 = p_00->nEntries;
      if (iVar22 < 1) {
        iVar23 = 0;
      }
      else {
        pwVar16 = *p_00->ppPages;
        if (pwVar16 == (word *)0x0) goto LAB_0023c807;
        uVar27 = 1;
        do {
          piVar10 = Vec_MemHashLookup(p_00,pwVar16 + (long)p_00->nEntrySize *
                                                     (long)(int)(uVar27 - 1 & p_00->PageMask));
          if (*piVar10 != -1) {
            __assert_fail("*pSpot == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
          }
          pVVar8 = p_00->vNexts;
          *piVar10 = pVVar8->nSize;
          Vec_IntPush(pVVar8,-1);
          iVar22 = p_00->nEntries;
          if (iVar22 <= (int)uVar27) break;
          pwVar16 = p_00->ppPages[uVar27 >> ((byte)p_00->LogPageSze & 0x1f)];
          uVar27 = uVar27 + 1;
        } while (pwVar16 != (word *)0x0);
        iVar23 = p_00->vNexts->nSize;
      }
      if (iVar22 != iVar23) {
LAB_0023c807:
        __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
      }
    }
    puVar11 = (uint *)Vec_MemHashLookup(p_00,pTruth);
    uVar27 = *puVar11;
    if (uVar27 == 0xffffffff) {
      pVVar8 = p_00->vNexts;
      *puVar11 = pVVar8->nSize;
      Vec_IntPush(pVVar8,-1);
      uVar35 = (ulong)p_00->nEntries;
      if ((long)uVar35 < 0) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
      }
      iVar22 = p_00->iPage;
      local_1a4 = (byte)p_00->LogPageSze;
      uVar27 = (uint)p_00->nEntries >> (local_1a4 & 0x1f);
      uVar28 = (ulong)uVar27;
      if (iVar22 < (int)uVar27) {
        iVar23 = p_00->nPageAlloc;
        local_160 = uVar35;
        if (iVar23 <= (int)uVar27) {
          iVar26 = uVar27 + 0x20;
          if (iVar23 != 0) {
            iVar26 = iVar23 * 2;
          }
          p_00->nPageAlloc = iVar26;
          if (p_00->ppPages == (word **)0x0) {
            ppwVar15 = (word **)malloc((long)iVar26 * 8);
          }
          else {
            ppwVar15 = (word **)realloc(p_00->ppPages,(long)iVar26 * 8);
            local_1a4 = (byte)p_00->LogPageSze;
            iVar22 = p_00->iPage;
          }
          p_00->ppPages = ppwVar15;
        }
        if (iVar22 < (int)uVar27) {
          iVar23 = p_00->nEntrySize;
          uVar35 = (long)iVar22;
          do {
            uVar30 = uVar35 + 1;
            pwVar16 = (word *)malloc((long)(iVar23 << (local_1a4 & 0x1f)) << 3);
            p_00->ppPages[uVar35 + 1] = pwVar16;
            uVar35 = uVar30;
          } while (uVar28 != uVar30);
        }
        p_00->iPage = uVar27;
        uVar28 = (ulong)((uint)local_160 >> (local_1a4 & 0x1f));
        uVar35 = local_160;
      }
      p_00->nEntries = (int)uVar35 + 1;
      memmove(p_00->ppPages[uVar28] + ((long)p_00->PageMask & uVar35) * (long)p_00->nEntrySize,
              pTruth,(long)p_00->nEntrySize << 3);
      iVar22 = p_00->nEntries;
      if (iVar22 != p_00->vNexts->nSize) {
        __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
      }
      uVar27 = iVar22 - 1;
    }
    else {
      iVar22 = p_00->nEntries;
    }
    uVar35 = (ulong)uVar27;
    if (iVar7 == iVar22) {
      if ((int)uVar27 < 0) goto LAB_0023c70f;
      lVar38 = alStack_148[iVar21];
    }
    else {
      if (((int)uVar27 < 0) || (lVar38 = alStack_148[iVar21], *(int *)(lVar38 + 4) <= (int)uVar27))
      goto LAB_0023c70f;
      if (*(int *)(*(long *)(lVar38 + 8) + uVar35 * 4) != -1) {
        __assert_fail("Vec_IntEntry(vTt2Class[nVars], truthId) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                      ,0x313,"Gia_Man_t *Gia_ManIsoNpnReduce(Gia_Man_t *, Vec_Ptr_t **, int)");
      }
      *(int *)(*(long *)(lVar38 + 8) + uVar35 * 4) = p_01->nSize;
      Vec_WecPushLevel(p_01);
    }
    if (*(int *)(lVar38 + 4) <= (int)uVar27) {
LAB_0023c70f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar21 = *(int *)(*(long *)(lVar38 + 8) + uVar35 * 4);
    if ((long)iVar21 < 0) {
      __assert_fail("Vec_IntEntry(vTt2Class[nVars], truthId) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                    ,0x317,"Gia_Man_t *Gia_ManIsoNpnReduce(Gia_Man_t *, Vec_Ptr_t **, int)");
    }
    if (p_01->nSize <= iVar21) {
      uVar36 = iVar21 + 1;
      uVar27 = p_01->nSize * 2;
      if ((int)uVar27 <= (int)uVar36) {
        uVar27 = uVar36;
      }
      iVar7 = p_01->nCap;
      if (iVar7 < (int)uVar27) {
        if (p_01->pArray == (Vec_Int_t *)0x0) {
          pVVar8 = (Vec_Int_t *)malloc((ulong)uVar27 << 4);
        }
        else {
          pVVar8 = (Vec_Int_t *)realloc(p_01->pArray,(ulong)uVar27 << 4);
        }
        p_01->pArray = pVVar8;
        memset(pVVar8 + iVar7,0,(long)(int)(uVar27 - iVar7) << 4);
        p_01->nCap = uVar27;
      }
      p_01->nSize = uVar36;
    }
    pVVar8 = p_01->pArray + iVar21;
LAB_0023b9ef:
    Vec_IntPush(pVVar8,iVar33);
  }
LAB_0023bf71:
  lVar37 = lVar37 + 1;
  pVVar8 = p->vCos;
  uVar35 = (ulong)pVVar8->nSize;
  if ((long)(uVar35 - (long)p->nRegs) <= lVar37) goto LAB_0023c2bf;
  goto LAB_0023b98a;
}

Assistant:

Gia_Man_t * Gia_ManIsoNpnReduce( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
    char pCanonPerm[16];
    int i, iObj, uCanonPhase, nVars, lastId, truthId;
    int IndexCon = -1, IndexVar = -1;
    Vec_Wec_t * vPosEquivs = Vec_WecAlloc( 100 );
    word * pTruth;
    Gia_Obj_t * pObj;
    Vec_Mem_t * vTtMem[17];   // truth table memory and hash table
    Gia_Man_t * pNew = NULL;
    Vec_Int_t * vLeaves = Vec_IntAlloc( 16 );
    Vec_Int_t * vFirsts;
    Vec_Int_t * vTt2Class[17];
    for ( i = 0; i < 17; i++ )
    {
        vTtMem[i] = Vec_MemAlloc( Abc_TtWordNum(i), 10 );
        Vec_MemHashAlloc( vTtMem[i], 1000 );
        vTt2Class[i] = Vec_IntStartFull( Gia_ManCoNum(p)+1 );
    }
    Gia_ObjComputeTruthTableStart( p, 16 );
    Gia_ManForEachPo( p, pObj, i )
    {
        iObj = Gia_ObjId(p, pObj);
        Gia_ManCollectCis( p, &iObj, 1, vLeaves );
        if ( Vec_IntSize(vLeaves) > 16 )
        {
            Vec_IntPush( Vec_WecPushLevel(vPosEquivs), i );
            continue;
        }
        pObj = Gia_ObjFanin0(pObj);
        if ( Gia_ObjIsConst0(pObj) )
        {
            if ( IndexCon == -1 )
            {
                IndexCon = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexCon, i );
            continue;
        }
        if ( Gia_ObjIsCi(pObj) )
        {
            if ( IndexVar == -1 )
            {
                IndexVar = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexVar, i );
            continue;
        }
        assert( Gia_ObjIsAnd(pObj) );
        pTruth = Gia_ObjComputeTruthTableCut( p, pObj, vLeaves );
        Abc_TtMinimumBase( pTruth, NULL, Vec_IntSize(vLeaves), &nVars );
        if ( nVars == 0 )
        {
            if ( IndexCon == -1 )
            {
                IndexCon = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexCon, i );
            continue;
        }
        if ( nVars == 1 )
        {
            if ( IndexVar == -1 )
            {
                IndexVar = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexVar, i );
            continue;
        }
        uCanonPhase = Abc_TtCanonicize( pTruth, nVars, pCanonPerm );
        lastId = Vec_MemEntryNum( vTtMem[nVars] );
        truthId = Vec_MemHashInsert( vTtMem[nVars], pTruth );
        if ( lastId != Vec_MemEntryNum( vTtMem[nVars] ) ) // new one
        {
            assert( Vec_IntEntry(vTt2Class[nVars], truthId) == -1 );
            Vec_IntWriteEntry( vTt2Class[nVars], truthId, Vec_WecSize(vPosEquivs) );
            Vec_WecPushLevel(vPosEquivs);
        }
        assert( Vec_IntEntry(vTt2Class[nVars], truthId) >= 0 );
        Vec_WecPush( vPosEquivs, Vec_IntEntry(vTt2Class[nVars], truthId), i );
    }
    Gia_ObjComputeTruthTableStop( p );
    Vec_IntFree( vLeaves );
    for ( i = 0; i < 17; i++ )
    {
        Vec_MemHashFree( vTtMem[i] );
        Vec_MemFree( vTtMem[i] );
        Vec_IntFree( vTt2Class[i] );
    }

    // find the first outputs and derive GIA
    vFirsts = Vec_WecCollectFirsts( vPosEquivs );
    pNew = Gia_ManDupCones( p, Vec_IntArray(vFirsts), Vec_IntSize(vFirsts), 0 );
    Vec_IntFree( vFirsts );
    // report and return    
    if ( fVerbose )
    { 
        printf( "Nontrivial classes:\n" );
        Vec_WecPrint( vPosEquivs, 1 );
    }
    if ( pvPosEquivs )
        *pvPosEquivs = Vec_WecConvertToVecPtr( vPosEquivs );
    Vec_WecFree( vPosEquivs );
    return pNew;
}